

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * __thiscall
glcts::anon_unknown_0::ShaderStorageBufferObjectBase::GLenumToString
          (ShaderStorageBufferObjectBase *this,GLenum e)

{
  GLenum e_local;
  ShaderStorageBufferObjectBase *this_local;
  
  if (e == 0x8f39) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_20b636;
  }
  else if (e == 0x90d3) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_20b576;
  }
  else if (e == 0x90d4) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_20b582;
  }
  else if (e == 0x90d5) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_20b59a;
  }
  else if (e == 0x90d6) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_20b5b2;
  }
  else if (e == 0x90da) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_20b5fa;
  }
  else if (e == 0x90db) {
    this_local = (ShaderStorageBufferObjectBase *)0x2c3715f;
  }
  else if (e == 0x90dc) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_20b612;
  }
  else if (e == 0x90dd) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_20b62a;
  }
  else if (e == 0x90de) {
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_20b61e;
  }
  else {
    if (e != 0x90df) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cShaderStorageBufferObjectTests.cpp"
                    ,0x1e3,
                    "const char *glcts::(anonymous namespace)::ShaderStorageBufferObjectBase::GLenumToString(GLenum)"
                   );
    }
    this_local = (ShaderStorageBufferObjectBase *)anon_var_dwarf_20b642;
  }
  return (char *)this_local;
}

Assistant:

const char* GLenumToString(GLenum e)
	{
		switch (e)
		{
		case GL_SHADER_STORAGE_BUFFER_BINDING:
			return "GL_SHADER_STORAGE_BUFFER_BINDING";
		case GL_SHADER_STORAGE_BUFFER_START:
			return "GL_SHADER_STORAGE_BUFFER_START";
		case GL_SHADER_STORAGE_BUFFER_SIZE:
			return "GL_SHADER_STORAGE_BUFFER_SIZE";
		case GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS";
		case GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS";
		case GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS";
		case GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS:
			return "GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS";
		case GL_MAX_SHADER_STORAGE_BLOCK_SIZE:
			return "GL_MAX_SHADER_STORAGE_BLOCK_SIZE";
		case GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS:
			return "GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS";
		case GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES:
			return "GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES";
		case GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT:
			return "GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT";

		default:
			assert(0);
			break;
		}
		return NULL;
	}